

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986Authority(xmlURIPtr uri,char **str)

{
  int iVar1;
  char *pcStack_28;
  int ret;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  pcStack_28 = *str;
  cur = (char *)str;
  str_local = &uri->scheme;
  iVar1 = xmlParse3986Userinfo(uri,&stack0xffffffffffffffd8);
  if ((iVar1 == 0) && (*pcStack_28 == '@')) {
    pcStack_28 = pcStack_28 + 1;
  }
  else {
    pcStack_28 = *(char **)cur;
  }
  uri_local._4_4_ = xmlParse3986Host((xmlURIPtr)str_local,&stack0xffffffffffffffd8);
  if (uri_local._4_4_ == 0) {
    if (*pcStack_28 == ':') {
      pcStack_28 = pcStack_28 + 1;
      iVar1 = xmlParse3986Port((xmlURIPtr)str_local,&stack0xffffffffffffffd8);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    *(char **)cur = pcStack_28;
    uri_local._4_4_ = 0;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986Authority(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;
    /*
     * try to parse an userinfo and check for the trailing @
     */
    ret = xmlParse3986Userinfo(uri, &cur);
    if ((ret != 0) || (*cur != '@'))
        cur = *str;
    else
        cur++;
    ret = xmlParse3986Host(uri, &cur);
    if (ret != 0) return(ret);
    if (*cur == ':') {
        cur++;
        ret = xmlParse3986Port(uri, &cur);
	if (ret != 0) return(ret);
    }
    *str = cur;
    return(0);
}